

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void unixModeBit(unixFile *pFile,uchar mask,int *pArg)

{
  int *pArg_local;
  uchar mask_local;
  unixFile *pFile_local;
  
  if (*pArg < 0) {
    *pArg = (uint)((pFile->ctrlFlags & (ushort)mask) != 0);
  }
  else if (*pArg == 0) {
    pFile->ctrlFlags = pFile->ctrlFlags & (mask ^ 0xffff);
  }
  else {
    pFile->ctrlFlags = pFile->ctrlFlags | (ushort)mask;
  }
  return;
}

Assistant:

static void unixModeBit(unixFile *pFile, unsigned char mask, int *pArg){
  if( *pArg<0 ){
    *pArg = (pFile->ctrlFlags & mask)!=0;
  }else if( (*pArg)==0 ){
    pFile->ctrlFlags &= ~mask;
  }else{
    pFile->ctrlFlags |= mask;
  }
}